

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O2

string * duckdb_apache::thrift::to_string<std::_Bit_const_iterator>
                   (string *__return_storage_ptr__,_Bit_const_iterator *beg,_Bit_const_iterator *end
                   )

{
  string *psVar1;
  uint uVar2;
  ulong *puVar3;
  bool bVar4;
  ostringstream o;
  bool local_1d1;
  string *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  puVar3 = (beg->super__Bit_iterator_base)._M_p;
  uVar2 = (beg->super__Bit_iterator_base)._M_offset;
  while ((psVar1 = local_1d0, puVar3 != (end->super__Bit_iterator_base)._M_p ||
         (uVar2 != (end->super__Bit_iterator_base)._M_offset))) {
    if ((puVar3 != (beg->super__Bit_iterator_base)._M_p) ||
       (uVar2 != (beg->super__Bit_iterator_base)._M_offset)) {
      std::operator<<((ostream *)local_1a8,", ");
    }
    local_1d1 = (*puVar3 >> ((ulong)uVar2 & 0x3f) & 1) != 0;
    to_string<bool>(&local_1c8,&local_1d1);
    std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar4 = uVar2 == 0x3f;
    uVar2 = uVar2 + 1;
    if (bVar4) {
      uVar2 = 0;
    }
    puVar3 = puVar3 + bVar4;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return psVar1;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}